

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyserTests.cpp
# Opt level: O3

void __thiscall
SemanticAnalyserTest_VariableDefinitionsWork_Test::
~SemanticAnalyserTest_VariableDefinitionsWork_Test
          (SemanticAnalyserTest_VariableDefinitionsWork_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SemanticAnalyserTest, VariableDefinitionsWork)
{
  std::string source = R"SRC(
  fn main(): f32
  {
    let x: f32 = 2;
    let y: f32 = 5;

    ret 0;
  }
  )SRC";
  nothrowTest(source);
}